

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.hpp
# Opt level: O3

Socket<512UL> __thiscall
ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>::
openUnicastSocket<512ul>
          (Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog> *this,
          address_v4 *addr)

{
  socklen_t __len;
  io_context *__args;
  in_addr_t *in_RDX;
  sockaddr *__addr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Socket<512UL> SVar1;
  network_interface<0,_32,_41,_17> local_3c;
  undefined8 local_34;
  undefined8 uStack_2c;
  undefined4 local_24;
  
  __args = *(io_context **)addr;
  *(undefined8 *)this = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ableton::platforms::asio::Socket<512ul>::Impl,std::allocator<ableton::platforms::asio::Socket<512ul>::Impl>,asio::io_context&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),(Impl **)this,
             (allocator<ableton::platforms::asio::Socket<512UL>::Impl> *)&local_3c,__args);
  __len = (socklen_t)__args;
  local_3c.ipv4_value_.s_addr = (in_addr_t)((char)*in_RDX == '\x7f');
  local_3c.ipv6_value_ = local_3c.ipv4_value_.s_addr;
  ::asio::basic_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>::
  set_option<asio::ip::detail::socket_option::multicast_enable_loopback<0,34,41,19>>
            (*(basic_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>> **)this,
             (multicast_enable_loopback<0,_34,_41,_19> *)&local_3c);
  local_3c.ipv4_value_.s_addr = *in_RDX;
  local_3c.ipv6_value_ = 0;
  ::asio::basic_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>::
  set_option<asio::ip::detail::socket_option::network_interface<0,32,41,17>>
            (*(basic_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>> **)this,
             &local_3c);
  local_3c.ipv6_value_ = *in_RDX;
  local_34 = 0;
  uStack_2c = 0;
  local_24 = 0;
  local_3c.ipv4_value_.s_addr = 2;
  ::asio::basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>::bind
            (*(basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> **)this,
             (int)&local_3c,__addr,__len);
  SVar1.mpImpl.
  super___shared_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  SVar1.mpImpl.
  super___shared_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Socket<512UL>)
         SVar1.mpImpl.
         super___shared_ptr<ableton::platforms::asio::Socket<512UL>::Impl,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

Socket<BufferSize> openUnicastSocket(const ::asio::ip::address_v4& addr)
  {
    auto socket = Socket<BufferSize>{*mpService};
    socket.mpImpl->mSocket.set_option(
      ::asio::ip::multicast::enable_loopback(addr.is_loopback()));
    socket.mpImpl->mSocket.set_option(::asio::ip::multicast::outbound_interface(addr));
    socket.mpImpl->mSocket.bind(::asio::ip::udp::endpoint{addr, 0});
    return socket;
  }